

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O3

int __thiscall Settings::extraArgumentChecks(Settings *this)

{
  size_t sVar1;
  ostream *poVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar1 = this->nDecomp;
  if (sVar1 == 0 && 1 < this->nProc) {
    poVar2 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ERROR : Missing decomposition for parallel program (see -d option)",0x42);
  }
  else {
    if (sVar1 == 0) {
      uVar4 = 1;
    }
    else {
      uVar4 = 1;
      sVar3 = 0;
      do {
        uVar4 = uVar4 * (this->processDecomp).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar3];
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
    if (uVar4 == this->nProc) {
      return 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR : Product of decomposition values = ",0x2a);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," must equal the number of processes = ",0x26);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return 1;
}

Assistant:

int Settings::extraArgumentChecks()
{
    if (!nDecomp && nProc > 1)
    {
        std::cout << "ERROR : Missing decomposition for parallel program (see "
                     "-d option)"
                  << std::endl;
        return 1;
    }

    size_t N = 1;
    for (size_t i = 0; i < nDecomp; ++i)
    {
        N *= processDecomp[i];
    }

    if (N != nProc)
    {
        std::cout << "ERROR : Product of decomposition values = " << N
                  << " must equal the number of processes = " << nProc << std::endl;
        return 1;
    }
    return 0;
}